

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringstream.cpp
# Opt level: O0

void __thiscall
embree::StringStream::StringStream
          (StringStream *this,Ref<embree::Stream<int>_> *cin,string *seps,string *endl,
          bool multiLine)

{
  string *in_RCX;
  long *in_RSI;
  undefined8 *in_RDI;
  byte in_R8B;
  string *chrs;
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffb0;
  
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Stream
            (in_stack_ffffffffffffffb0);
  *in_RDI = &PTR__StringStream_00600d30;
  chrs = (string *)(in_RDI + 8);
  *(long *)chrs = *in_RSI;
  if (*(long *)chrs != 0) {
    (**(code **)(**(long **)chrs + 0x10))();
  }
  std::__cxx11::string::string((string *)(in_RDI + 0x49),in_RCX);
  *(byte *)(in_RDI + 0x4d) = in_R8B & 1;
  createCharMap((bool *)in_stack_ffffffffffffffb0,chrs);
  createCharMap((bool *)in_stack_ffffffffffffffb0,chrs);
  return;
}

Assistant:

StringStream::StringStream(const Ref<Stream<int> >& cin, const std::string& seps, const std::string& endl, bool multiLine)
    : cin(cin), endl(endl), multiLine(multiLine)
  {
    createCharMap(isSepMap,seps);
    createCharMap(isValidCharMap,stringChars);
  }